

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O1

int Res_SatSimulate(Res_Sim_t *p,int nPatsLimit,int fOnSet)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sat_solver *s;
  uint *__ptr;
  void *pvVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (p->pAig->vPos->nSize < 2) {
LAB_00482957:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar6 = (&p->nPats0)[fOnSet != 0];
  if (nPatsLimit <= iVar6) {
    __assert_fail("iPat < nPatsLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                  ,0xeb,"int Res_SatSimulate(Res_Sim_t *, int, int)");
  }
  pVVar4 = (&p->vPats0)[fOnSet != 0];
  s = (sat_solver *)Res_SatSimulateConstr(p->pAig,fOnSet);
  s->fSkipSimplify = 1;
  iVar7 = sat_solver_simplify(s);
  if (iVar7 == 0) {
    uVar13 = -(uint)(iVar6 != 0);
  }
  else {
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 0x20;
    __ptr[1] = 0;
    pvVar9 = malloc(0x80);
    *(void **)(__ptr + 2) = pvVar9;
    uVar13 = 1;
    iVar7 = iVar6;
    if (iVar6 < nPatsLimit) {
      while (iVar8 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0), iVar8 == 1) {
        __ptr[1] = 0;
        if (0 < p->nTruePis) {
          local_38 = (long)(iVar6 >> 5);
          lVar12 = 0;
          do {
            pVVar5 = p->pAig->vPis;
            if (pVVar5->nSize <= lVar12) goto LAB_00482957;
            uVar13 = (uint)*(undefined8 *)((long)pVVar5->pArray[lVar12] + 0x40);
            if (((int)uVar13 < 0) || (s->size <= (int)uVar13)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                            ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
            }
            bVar14 = s->model[uVar13 & 0x7fffffff] == 1;
            if (bVar14) {
              if (pVVar4->nSize <= lVar12) goto LAB_00482957;
              puVar1 = (uint *)((long)pVVar4->pArray[lVar12] + local_38 * 4);
              *puVar1 = *puVar1 | 1 << ((byte)iVar6 & 0x1f);
            }
            uVar2 = __ptr[1];
            uVar3 = *__ptr;
            if (uVar2 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar9 = malloc(0x40);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr + 2),0x40);
                }
                *(void **)(__ptr + 2) = pvVar9;
                uVar11 = 0x10;
              }
              else {
                uVar11 = uVar3 * 2;
                if ((int)uVar11 <= (int)uVar3) goto LAB_004827df;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar9 = malloc((ulong)uVar3 << 3);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 3);
                }
                *(void **)(__ptr + 2) = pvVar9;
              }
              if (pvVar9 == (void *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              *__ptr = uVar11;
            }
LAB_004827df:
            __ptr[1] = uVar2 + 1;
            *(uint *)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 4) = (uint)bVar14 + uVar13 * 2;
            lVar12 = lVar12 + 1;
          } while (lVar12 < p->nTruePis);
        }
        iVar8 = sat_solver_addclause(s,*(lit **)(__ptr + 2),*(lit **)(__ptr + 2) + (int)__ptr[1]);
        iVar6 = iVar6 + 1;
        uVar13 = 1;
        iVar7 = iVar6;
        if ((iVar8 == 0) || (iVar7 = nPatsLimit, iVar6 == nPatsLimit)) goto LAB_0048288d;
      }
      iVar7 = iVar6;
      if (iVar8 == -1) {
        uVar13 = 1;
        if (iVar6 == 0) {
          if (fOnSet == 0) {
            p->fConst1 = 1;
          }
          else {
            p->fConst0 = 1;
          }
          uVar13 = 0;
          iVar7 = 0;
        }
      }
      else {
        uVar13 = (uint)(iVar6 != 0);
      }
    }
LAB_0048288d:
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (fOnSet == 0) {
      p->nPats0 = iVar7;
    }
    else {
      p->nPats1 = iVar7;
    }
  }
  sat_solver_delete(s);
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar12 + lVar10;
  return uVar13;
}

Assistant:

int Res_SatSimulate( Res_Sim_t * p, int nPatsLimit, int fOnSet )
{
    Vec_Int_t * vLits;
    Vec_Ptr_t * vPats;
    sat_solver * pSat;
    int RetValue = -1; // Suppress "might be used uninitialized"
    int i, k, value, status, Lit, Var, iPat;
    abctime clk = Abc_Clock();

//printf( "Looking for %s:  ", fOnSet? "onset " : "offset" );

    // decide what problem should be solved
    Lit = toLitCond( (int)(ABC_PTRUINT_T)Abc_NtkPo(p->pAig,1)->pCopy, !fOnSet );
    if ( fOnSet )
    {
        iPat = p->nPats1;
        vPats = p->vPats1;
    }
    else
    {
        iPat = p->nPats0;
        vPats = p->vPats0;
    }
    assert( iPat < nPatsLimit );

    // derive the SAT solver
    pSat = (sat_solver *)Res_SatSimulateConstr( p->pAig, fOnSet );
    pSat->fSkipSimplify = 1;
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        if ( iPat == 0 )
        {
//            if ( fOnSet )
//                p->fConst0 = 1;
//            else
//                p->fConst1 = 1;
            RetValue = 0;
        }
        goto finish;
    }
 
    // enumerate through the SAT assignments
    RetValue = 1;
    vLits = Vec_IntAlloc( 32 );
    for ( k = iPat; k < nPatsLimit; k++ )
    {
        // solve with the assumption
//        status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_False )
        {
//printf( "Const %d\n", !fOnSet );
            if ( k == 0 )
            {
                if ( fOnSet )
                    p->fConst0 = 1;
                else
                    p->fConst1 = 1;
                RetValue = 0;
            }
            break;
        }
        else if ( status == l_True )
        {
            // save the pattern
            Vec_IntClear( vLits );
            for ( i = 0; i < p->nTruePis; i++ )
            {
                Var = (int)(ABC_PTRUINT_T)Abc_NtkPi(p->pAig,i)->pCopy;
//                value = (int)(pSat->model.ptr[Var] == l_True);
                value = sat_solver_var_value(pSat, Var);
                if ( value )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vPats, i), k );
                Lit = toLitCond( Var, value );
                Vec_IntPush( vLits, Lit );
//                printf( "%d", value );
            }
//            printf( "\n" );

            status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            if ( status == 0 )
            {
                k++;
                RetValue = 1; 
                break;
            }
        }
        else
        {
//printf( "Undecided\n" );
            if ( k == 0 )
                RetValue = 0;
            else
                RetValue = 1; 
            break;
        }
    }
    Vec_IntFree( vLits );
//printf( "Found %d patterns\n", k - iPat );

    // set the new number of patterns
    if ( fOnSet )
        p->nPats1 = k;
    else
        p->nPats0 = k;

finish:

    sat_solver_delete( pSat );
p->timeSat += Abc_Clock() - clk;
    return RetValue;
}